

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_Shutdown(void)

{
  ImGuiMouseCursor cursor_n;
  GLFWkeyfun unaff_retaddr;
  GLFWwindow *in_stack_00000008;
  GLFWcursor *in_stack_00000010;
  int local_4;
  
  if (g_InstalledCallbacks) {
    glfwSetMouseButtonCallback(in_stack_00000008,(GLFWmousebuttonfun)unaff_retaddr);
    glfwSetScrollCallback(in_stack_00000008,(GLFWscrollfun)unaff_retaddr);
    glfwSetKeyCallback(in_stack_00000008,unaff_retaddr);
    glfwSetCharCallback(in_stack_00000008,(GLFWcharfun)unaff_retaddr);
    g_InstalledCallbacks = false;
  }
  for (local_4 = 0; local_4 < 9; local_4 = local_4 + 1) {
    glfwDestroyCursor(in_stack_00000010);
    g_MouseCursors[local_4] = (GLFWcursor *)0x0;
  }
  g_ClientApi = GlfwClientApi_Unknown;
  return;
}

Assistant:

void ImGui_ImplGlfw_Shutdown()
{
    if (g_InstalledCallbacks)
    {
        glfwSetMouseButtonCallback(g_Window, g_PrevUserCallbackMousebutton);
        glfwSetScrollCallback(g_Window, g_PrevUserCallbackScroll);
        glfwSetKeyCallback(g_Window, g_PrevUserCallbackKey);
        glfwSetCharCallback(g_Window, g_PrevUserCallbackChar);
        g_InstalledCallbacks = false;
    }

    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
    {
        glfwDestroyCursor(g_MouseCursors[cursor_n]);
        g_MouseCursors[cursor_n] = NULL;
    }
    g_ClientApi = GlfwClientApi_Unknown;
}